

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

LocaleHash __thiscall QMimeXMLProvider::localeComments(QMimeXMLProvider *this,QString *name)

{
  LocaleHash LVar1;
  QString *in_RDX;
  long in_FS_OFFSET;
  QMimeTypeXMLData QStack_88;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,_QMimeTypeXMLData>::value
            (&QStack_88,(QHash<QString,_QMimeTypeXMLData> *)(name + 2),in_RDX);
  LVar1.d = QStack_88.localeComments.d;
  QStack_88.localeComments.d = (Data *)0x0;
  (this->super_QMimeProviderBase)._vptr_QMimeProviderBase = (_func_int **)LVar1.d;
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_88.globPatterns.d);
  if (&(QStack_88.iconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_88.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_88.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((QStack_88.iconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(QStack_88.iconName.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(QStack_88.genericIconName.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_88.genericIconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((QStack_88.genericIconName.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_88.genericIconName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(QStack_88.genericIconName.d.d)->super_QArrayData,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&QStack_88.localeComments);
  if (&(QStack_88.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_88.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_88.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (LocaleHash)(Data *)this;
  }
  __stack_chk_fail();
}

Assistant:

QMimeTypePrivate::LocaleHash QMimeXMLProvider::localeComments(const QString &name)
{
    return m_nameMimeTypeMap.value(name).localeComments;
}